

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_2.cpp
# Opt level: O3

bool is_valid(Date *d)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = d->y;
  if ((int)uVar1 < 1) {
    return false;
  }
  uVar2 = d->m;
  uVar3 = d->d;
  if ((int)uVar3 < 1 || 0xb < uVar2 - 1) {
    return false;
  }
  if (uVar2 < 0xc) {
    if ((0xa50U >> (uVar2 & 0x1f) & 1) != 0) {
      if (uVar3 < 0x1f) {
        return true;
      }
      goto LAB_0010249b;
    }
    if (uVar2 != 2) goto LAB_00102458;
    if ((uVar1 & 3) != 0) goto LAB_0010249b;
  }
  else {
LAB_00102458:
    if (uVar3 < 0x20) {
      return true;
    }
    if ((uVar1 & 3) != 0 || uVar2 != 2) goto LAB_0010249b;
  }
  if ((0x28f5c28 < (uVar1 * -0x3d70a3d7 >> 2 | uVar1 * 0x40000000) ||
      (uVar1 * -0x3d70a3d7 >> 4 | uVar1 * -0x70000000) < 0xa3d70b) && uVar3 < 0x1e) {
    return true;
  }
LAB_0010249b:
  return uVar3 < 0x1d;
}

Assistant:

bool is_valid(const Date& d)
{
	bool is_valid = d.y > 0 && (d.m > 0 && d.m < 13) && d.d > 0;
	is_valid = is_valid && (
		(is_31_day_month(d.m) && d.d < 32) ||
		(is_30_day_month(d.m) && d.d < 31) ||
		(d.m == 2 && (is_leap(d) && d.d < 30) || d.d < 29)
		);
	return is_valid;
}